

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_sse3.c
# Opt level: O0

void av1_nn_propagate_4to8_sse3
               (float *inputs,float *weights,__m128 *out_h,__m128 *out_l,int num_inputs)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  float *in_RCX;
  long lVar6;
  float *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  __m128 inputs128;
  int local_17c;
  float local_178 [16];
  undefined8 local_138;
  undefined8 uStack_130;
  int local_124;
  float *local_120;
  float *local_118;
  long local_110;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  __m128 hh1;
  __m128 hh0;
  __m128 mul1;
  __m128 mul0;
  __m128 weight1;
  __m128 weight0;
  float fStack_18;
  int i;
  float fStack_10;
  float fStack_c;
  
  local_138 = *in_RDI;
  uStack_130 = in_RDI[1];
  local_124 = in_R8D;
  local_120 = in_RCX;
  local_118 = in_RDX;
  local_110 = in_RSI;
  for (local_17c = 0; local_17c < 4; local_17c = local_17c + 1) {
    puVar5 = (undefined8 *)(local_110 + (long)(local_17c * 2 * local_124) * 4);
    uVar1 = *puVar5;
    uVar2 = puVar5[1];
    puVar5 = (undefined8 *)(local_110 + (long)((local_17c * 2 + 1) * local_124) * 4);
    uVar3 = *puVar5;
    uVar4 = puVar5[1];
    local_b8 = (float)local_138;
    fStack_b4 = (float)((ulong)local_138 >> 0x20);
    fStack_b0 = (float)uStack_130;
    fStack_ac = (float)((ulong)uStack_130 >> 0x20);
    local_c8 = (float)uVar1;
    fStack_c4 = (float)((ulong)uVar1 >> 0x20);
    fStack_c0 = (float)uVar2;
    fStack_bc = (float)((ulong)uVar2 >> 0x20);
    local_e8 = (float)uVar3;
    fStack_e4 = (float)((ulong)uVar3 >> 0x20);
    fStack_e0 = (float)uVar4;
    fStack_dc = (float)((ulong)uVar4 >> 0x20);
    lVar6 = (long)local_17c;
    local_178[lVar6 * 4] = local_b8 * local_c8 + fStack_b4 * fStack_c4;
    local_178[lVar6 * 4 + 1] = fStack_b0 * fStack_c0 + fStack_ac * fStack_bc;
    local_178[lVar6 * 4 + 2] = local_b8 * local_e8 + fStack_b4 * fStack_e4;
    local_178[lVar6 * 4 + 3] = fStack_b0 * fStack_e0 + fStack_ac * fStack_dc;
  }
  hh1[2] = (float)local_178._0_8_;
  hh1[3] = SUB84(local_178._0_8_,4);
  hh0[0] = (float)local_178._8_8_;
  hh0[1] = SUB84(local_178._8_8_,4);
  fStack_88 = (float)local_178._16_8_;
  fStack_84 = SUB84(local_178._16_8_,4);
  hh1[0] = (float)local_178._24_8_;
  hh1[1] = SUB84(local_178._24_8_,4);
  local_98 = (float)local_178._32_8_;
  fStack_94 = SUB84(local_178._32_8_,4);
  fStack_90 = (float)local_178._40_8_;
  fStack_8c = SUB84(local_178._40_8_,4);
  local_a8 = (float)local_178._48_8_;
  fStack_a4 = SUB84(local_178._48_8_,4);
  fStack_a0 = (float)local_178._56_8_;
  fStack_9c = SUB84(local_178._56_8_,4);
  fStack_18 = (float)*(undefined8 *)local_118;
  i = (int)((ulong)*(undefined8 *)local_118 >> 0x20);
  fStack_10 = (float)*(undefined8 *)(local_118 + 2);
  fStack_c = (float)((ulong)*(undefined8 *)(local_118 + 2) >> 0x20);
  *local_118 = fStack_18 + local_98 + fStack_94;
  local_118[1] = (float)i + fStack_90 + fStack_8c;
  local_118[2] = fStack_10 + local_a8 + fStack_a4;
  local_118[3] = fStack_c + fStack_a0 + fStack_9c;
  weight1[2] = (float)*(undefined8 *)local_120;
  weight1[3] = (float)((ulong)*(undefined8 *)local_120 >> 0x20);
  weight0[0] = (float)*(undefined8 *)(local_120 + 2);
  weight0[1] = (float)((ulong)*(undefined8 *)(local_120 + 2) >> 0x20);
  *local_120 = weight1[2] + hh1[2] + hh1[3];
  local_120[1] = weight1[3] + hh0[0] + hh0[1];
  local_120[2] = weight0[0] + fStack_88 + fStack_84;
  local_120[3] = weight0[1] + hh1[0] + hh1[1];
  return;
}

Assistant:

void av1_nn_propagate_4to8_sse3(const float *const inputs,
                                const float *const weights, __m128 *const out_h,
                                __m128 *const out_l, const int num_inputs) {
  const __m128 inputs128 = _mm_loadu_ps(inputs);

  __m128 hadd[4];
  for (int i = 0; i < 4; i++) {  // For each pair of outputs
    const __m128 weight0 = _mm_loadu_ps(&weights[2 * i * num_inputs]);
    const __m128 weight1 = _mm_loadu_ps(&weights[(2 * i + 1) * num_inputs]);
    const __m128 mul0 = _mm_mul_ps(inputs128, weight0);
    const __m128 mul1 = _mm_mul_ps(inputs128, weight1);
    hadd[i] = _mm_hadd_ps(mul0, mul1);
  }
  // hadd[0] = [7+6 5+4 3+2 1+0] (weight indices)
  // hadd[1] = [15+14 13+12 11+10 9+8]
  // hadd[2] = [23+22 21+20 19+18 17+16]
  // hadd[3] = [31+30 29+28 27+26 25+24]

  const __m128 hh0 = _mm_hadd_ps(hadd[0], hadd[1]);
  // [15+14+13+12 11+10+9+8 7+6+5+4 3+2+1+0]
  const __m128 hh1 = _mm_hadd_ps(hadd[2], hadd[3]);
  // [31+30+29+28 27+26+25+24 23+22+21+20 19+18+17+16]

  *out_h = _mm_add_ps(*out_h, hh1);
  *out_l = _mm_add_ps(*out_l, hh0);
}